

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O1

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftOrigin<float>::CalcMatrix
          (TPZSTShiftOrigin<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A)

{
  float fVar1;
  TPZSpectralTransform<float> TVar2;
  long lVar3;
  long *plVar4;
  TPZSpectralTransform<float> *in_RDX;
  long lVar5;
  float local_2c;
  
  TVar2 = *in_RDX;
  lVar3 = *(long *)(*(long *)TVar2 + 8);
  this->super_TPZSpectralTransform<float> = TVar2;
  LOCK();
  *(int *)((long)TVar2 + 8) = *(int *)((long)TVar2 + 8) + 1;
  UNLOCK();
  if (0 < lVar3) {
    fVar1 = *(float *)&A[1].fRef;
    lVar5 = 0;
    do {
      plVar4 = *(long **)this->super_TPZSpectralTransform<float>;
      local_2c = (float)(**(code **)(*plVar4 + 0x120))(plVar4,lVar5,lVar5);
      local_2c = local_2c - fVar1;
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar5,lVar5,&local_2c);
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}